

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

void cfl_luma_subsampling_422_lbd_avx2
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar4 [16];
  __m256i top_16x16;
  __m256i top;
  __m256i *row_end;
  __m256i *row;
  __m256i fours;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_168;
  undefined1 (*local_118) [32];
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpinsrb_avx(ZEXT116(4),4,1);
  auVar1 = vpinsrb_avx(auVar1,4,2);
  auVar1 = vpinsrb_avx(auVar1,4,3);
  auVar1 = vpinsrb_avx(auVar1,4,4);
  auVar1 = vpinsrb_avx(auVar1,4,5);
  auVar1 = vpinsrb_avx(auVar1,4,6);
  auVar1 = vpinsrb_avx(auVar1,4,7);
  auVar1 = vpinsrb_avx(auVar1,4,8);
  auVar1 = vpinsrb_avx(auVar1,4,9);
  auVar1 = vpinsrb_avx(auVar1,4,10);
  auVar1 = vpinsrb_avx(auVar1,4,0xb);
  auVar1 = vpinsrb_avx(auVar1,4,0xc);
  auVar1 = vpinsrb_avx(auVar1,4,0xd);
  auVar1 = vpinsrb_avx(auVar1,4,0xe);
  auVar1 = vpinsrb_avx(auVar1,4,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(4),4,1);
  auVar2 = vpinsrb_avx(auVar2,4,2);
  auVar2 = vpinsrb_avx(auVar2,4,3);
  auVar2 = vpinsrb_avx(auVar2,4,4);
  auVar2 = vpinsrb_avx(auVar2,4,5);
  auVar2 = vpinsrb_avx(auVar2,4,6);
  auVar2 = vpinsrb_avx(auVar2,4,7);
  auVar2 = vpinsrb_avx(auVar2,4,8);
  auVar2 = vpinsrb_avx(auVar2,4,9);
  auVar2 = vpinsrb_avx(auVar2,4,10);
  auVar2 = vpinsrb_avx(auVar2,4,0xb);
  auVar2 = vpinsrb_avx(auVar2,4,0xc);
  auVar2 = vpinsrb_avx(auVar2,4,0xd);
  auVar2 = vpinsrb_avx(auVar2,4,0xe);
  auVar2 = vpinsrb_avx(auVar2,4,0xf);
  auVar4 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_70 = auVar4._0_8_;
  uStack_68 = auVar4._8_8_;
  local_168 = in_RDX;
  local_118 = in_RDI;
  do {
    auVar3._16_8_ = uStack_70;
    auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar3._24_8_ = uStack_68;
    auVar3 = vpmaddubsw_avx2(*local_118,auVar3);
    local_1c0 = auVar3._0_8_;
    uStack_1b8 = auVar3._8_8_;
    uStack_1b0 = auVar3._16_8_;
    uStack_1a8 = auVar3._24_8_;
    *local_168 = local_1c0;
    local_168[1] = uStack_1b8;
    local_168[2] = uStack_1b0;
    local_168[3] = uStack_1a8;
    local_118 = (undefined1 (*) [32])(*local_118 + in_ESI);
    local_168 = local_168 + 8;
  } while (local_168 < in_RDX + (long)(in_R8D << 1) * 4);
  return;
}

Assistant:

static void cfl_luma_subsampling_422_lbd_avx2(const uint8_t *input,
                                              int input_stride,
                                              uint16_t *pred_buf_q3, int width,
                                              int height) {
  (void)width;                                // Forever 32
  const __m256i fours = _mm256_set1_epi8(4);  // Thirty two fours
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;
  do {
    __m256i top = _mm256_loadu_si256((__m256i *)input);
    __m256i top_16x16 = _mm256_maddubs_epi16(top, fours);
    _mm256_storeu_si256(row, top_16x16);
    input += input_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}